

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O1

uint64_t uv__hrtime(uv_clocktype_t type)

{
  int iVar1;
  clock_t local_30;
  clock_t clock_id;
  timespec t;
  uint64_t uStack_10;
  uv_clocktype_t type_local;
  
  local_30 = 1;
  t.tv_nsec._4_4_ = type;
  if ((type == UV_CLOCK_FAST) &&
     (local_30 = uv__hrtime::fast_clock_id, uv__hrtime::fast_clock_id == -1)) {
    local_30 = 1;
    iVar1 = clock_getres(6,(timespec *)&clock_id);
    if ((iVar1 == 0) && (t.tv_sec < 0xf4241)) {
      local_30 = 6;
    }
    uv__hrtime::fast_clock_id = local_30;
  }
  iVar1 = clock_gettime((clockid_t)local_30,(timespec *)&clock_id);
  if (iVar1 == 0) {
    uStack_10 = clock_id * 1000000000 + t.tv_sec;
  }
  else {
    uStack_10 = 0;
  }
  return uStack_10;
}

Assistant:

uint64_t uv__hrtime(uv_clocktype_t type) {
  static _Atomic clock_t fast_clock_id = -1;
  struct timespec t;
  clock_t clock_id;

  /* Prefer CLOCK_MONOTONIC_COARSE if available but only when it has
   * millisecond granularity or better.  CLOCK_MONOTONIC_COARSE is
   * serviced entirely from the vDSO, whereas CLOCK_MONOTONIC may
   * decide to make a costly system call.
   */
  /* TODO(bnoordhuis) Use CLOCK_MONOTONIC_COARSE for UV_CLOCK_PRECISE
   * when it has microsecond granularity or better (unlikely).
   */
  clock_id = CLOCK_MONOTONIC;
  if (type != UV_CLOCK_FAST)
    goto done;

  clock_id = atomic_load_explicit(&fast_clock_id, memory_order_relaxed);
  if (clock_id != -1)
    goto done;

  clock_id = CLOCK_MONOTONIC;
  if (0 == clock_getres(CLOCK_MONOTONIC_COARSE, &t))
    if (t.tv_nsec <= 1 * 1000 * 1000)
      clock_id = CLOCK_MONOTONIC_COARSE;

  atomic_store_explicit(&fast_clock_id, clock_id, memory_order_relaxed);

done:

  if (clock_gettime(clock_id, &t))
    return 0;  /* Not really possible. */

  return t.tv_sec * (uint64_t) 1e9 + t.tv_nsec;
}